

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_profile.c
# Opt level: O3

char * nextVis(char *ptr,char *cont)

{
  char cVar1;
  ushort **ppuVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  
  if (cont == (char *)0x0) {
    cVar5 = *ptr;
    if ((long)cVar5 == 0) {
      return ptr;
    }
    ppuVar2 = __ctype_b_loc();
    if ((cVar5 == ':') || (((*ppuVar2)[cVar5] & 0x2000) != 0)) {
      ptr = ptr + 1;
LAB_0010a079:
      cVar5 = *ptr;
      if (cVar5 == '\0') {
        return ptr;
      }
      ppuVar2 = __ctype_b_loc();
      pcVar4 = ptr + 1;
      do {
        if ((*(byte *)((long)*ppuVar2 + (long)cVar5 * 2 + 1) & 0x20) == 0) {
          if (cVar5 == ':') {
            do {
              pcVar3 = pcVar4;
              if ((long)*pcVar3 == 0) {
                return pcVar3;
              }
              pcVar4 = pcVar3 + 1;
            } while ((*(byte *)((long)*ppuVar2 + (long)*pcVar3 * 2 + 1) & 0x20) != 0);
            return pcVar3;
          }
          break;
        }
        cVar5 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar5 != '\0');
      return pcVar4 + -1;
    }
  }
  else {
    do {
      cVar5 = *cont;
      if (cVar5 == '\0') goto LAB_0010a079;
      cVar1 = *ptr;
      if ((long)cVar1 == 0) {
        return ptr;
      }
      ppuVar2 = __ctype_b_loc();
      if ((cVar1 == ':') || (((*ppuVar2)[cVar1] & 0x2000) != 0)) goto LAB_0010a079;
      ptr = ptr + 1;
      cont = cont + 1;
    } while (cVar1 == cVar5);
  }
  return (char *)0x0;
}

Assistant:

static const char *nextVis(const char *ptr, const char *cont)
{
	if (cont) {
		while (*cont) {
			if (!*ptr || (isspace(*ptr) || *ptr == ':')) {
				break;
			}
			if (*ptr++ != *cont++) {
				return 0;
			}
		}
	}
	else {
		if (!*ptr) {
			return ptr;
		}
		if (!isspace(*ptr) && *ptr != ':') {
			return 0;
		}
		++ptr;
	}
	while (*ptr && isspace(*ptr)) ++ptr;
	if (*ptr && *ptr == ':') {
		++ptr;
		while (*ptr && isspace(*ptr)) ++ptr;
	}
	return ptr;
}